

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
wasm::SmallVector<wasm::HeapType,_1UL>::push_back
          (SmallVector<wasm::HeapType,_1UL> *this,HeapType *x)

{
  size_type __n;
  reference pvVar1;
  HeapType *x_local;
  SmallVector<wasm::HeapType,_1UL> *this_local;
  
  if (this->usedFixed == 0) {
    __n = this->usedFixed;
    this->usedFixed = __n + 1;
    pvVar1 = std::array<wasm::HeapType,_1UL>::operator[](&this->fixed,__n);
    pvVar1->id = x->id;
  }
  else {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back(&this->flexible,x);
  }
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }